

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O2

char * VulkanUtilities::VkImageLayoutToString(VkImageLayout Layout)

{
  char *pcVar1;
  string msg;
  string local_28;
  
  switch(Layout) {
  case VK_IMAGE_LAYOUT_UNDEFINED:
    pcVar1 = "VK_IMAGE_LAYOUT_UNDEFINED";
    break;
  case VK_IMAGE_LAYOUT_GENERAL:
    pcVar1 = "VK_IMAGE_LAYOUT_GENERAL";
    break;
  case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
    pcVar1 = "VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL";
    break;
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
    pcVar1 = "VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL";
    break;
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:
    pcVar1 = "VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL";
    break;
  case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
    pcVar1 = "VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL";
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
    pcVar1 = "VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL";
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
    pcVar1 = "VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL";
    break;
  case VK_IMAGE_LAYOUT_PREINITIALIZED:
    pcVar1 = "VK_IMAGE_LAYOUT_PREINITIALIZED";
    break;
  default:
    if (Layout == VK_IMAGE_LAYOUT_PRESENT_SRC_KHR) {
      pcVar1 = "VK_IMAGE_LAYOUT_PRESENT_SRC_KHR";
    }
    else if (Layout == VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR) {
      pcVar1 = "VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR";
    }
    else if (Layout == VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL) {
      pcVar1 = "VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL";
    }
    else if (Layout == VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL) {
      pcVar1 = "VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL";
    }
    else {
      Diligent::FormatString<char[15]>(&local_28,(char (*) [15])"Unknown layout");
      Diligent::DebugAssertionFailed
                (local_28._M_dataplus._M_p,"VkImageLayoutToString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0x2cc);
      std::__cxx11::string::~string((string *)&local_28);
      pcVar1 = "";
    }
  }
  return pcVar1;
}

Assistant:

const char* VkImageLayoutToString(VkImageLayout Layout)
{
    switch (Layout)
    {
        // clang-format off
#define IMAGE_LAYOUT_TO_STRING(LAYOUT)case LAYOUT: return #LAYOUT;
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_UNDEFINED)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_GENERAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_PREINITIALIZED)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_PRESENT_SRC_KHR)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR)
#undef IMAGE_LAYOUT_TO_STRING
        default: UNEXPECTED("Unknown layout"); return "";
            // clang-format on
    }
}